

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommandArguments.cxx
# Opt level: O2

bool __thiscall cmInstallCommandArguments::CheckPermissions(cmInstallCommandArguments *this)

{
  string *psVar1;
  string *psVar2;
  bool bVar3;
  string *onePermission;
  
  std::__cxx11::string::assign((char *)&this->PermissionsString);
  psVar2 = (this->Permissions).Vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    onePermission = psVar2;
    psVar1 = (this->Permissions).Vector.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (onePermission == psVar1) break;
    bVar3 = CheckPermissions(onePermission,&this->PermissionsString);
    psVar2 = onePermission + 1;
  } while (bVar3);
  return onePermission == psVar1;
}

Assistant:

bool cmInstallCommandArguments::CheckPermissions()
{
  this->PermissionsString = "";
  for(std::vector<std::string>::const_iterator
      permIt = this->Permissions.GetVector().begin();
      permIt != this->Permissions.GetVector().end();
      ++permIt)
    {
    if (!this->CheckPermissions(*permIt, this->PermissionsString))
      {
      return false;
      }
    }
  return true;
}